

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_buildCTable_raw(FSE_CTable *ct,uint nbBits)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  short sVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar31;
  int iVar34;
  undefined1 auVar32 [16];
  int iVar35;
  undefined1 auVar33 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar38 [16];
  long lVar13;
  
  uVar6 = 1 << ((byte)nbBits & 0x1f);
  if (nbBits != 0) {
    *(short *)ct = (short)nbBits;
    sVar3 = (short)uVar6;
    *(short *)((long)ct + 2) = sVar3 + -1;
    auVar5 = _DAT_0025e440;
    uVar7 = (ulong)uVar6;
    lVar13 = uVar7 - 1;
    auVar9._8_4_ = (int)lVar13;
    auVar9._0_8_ = lVar13;
    auVar9._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar8 = 0;
    auVar9 = auVar9 ^ _DAT_0025e440;
    auVar12 = _DAT_002619f0;
    auVar14 = _DAT_00261a00;
    auVar15 = _DAT_00261a10;
    auVar16 = _DAT_0025e430;
    do {
      auVar17 = auVar16 ^ auVar5;
      iVar31 = auVar9._0_4_;
      iVar30 = -(uint)(iVar31 < auVar17._0_4_);
      iVar10 = auVar9._4_4_;
      auVar18._4_4_ = -(uint)(iVar10 < auVar17._4_4_);
      iVar35 = auVar9._8_4_;
      iVar34 = -(uint)(iVar35 < auVar17._8_4_);
      iVar11 = auVar9._12_4_;
      auVar18._12_4_ = -(uint)(iVar11 < auVar17._12_4_);
      auVar27._4_4_ = iVar30;
      auVar27._0_4_ = iVar30;
      auVar27._8_4_ = iVar34;
      auVar27._12_4_ = iVar34;
      auVar36 = pshuflw(in_XMM11,auVar27,0xe8);
      auVar20._4_4_ = -(uint)(auVar17._4_4_ == iVar10);
      auVar20._12_4_ = -(uint)(auVar17._12_4_ == iVar11);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar38 = pshuflw(in_XMM12,auVar20,0xe8);
      auVar18._0_4_ = auVar18._4_4_;
      auVar18._8_4_ = auVar18._12_4_;
      auVar37 = pshuflw(auVar36,auVar18,0xe8);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar17 = (auVar37 | auVar38 & auVar36) ^ auVar17;
      auVar17 = packssdw(auVar17,auVar17);
      sVar4 = (short)uVar8;
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)((long)ct + uVar8 * 2 + 4) = sVar3 + sVar4;
      }
      auVar18 = auVar20 & auVar27 | auVar18;
      auVar17 = packssdw(auVar18,auVar18);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
      if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
        *(short *)((long)ct + uVar8 * 2 + 6) = sVar3 + sVar4 + 1;
      }
      auVar17 = auVar15 ^ auVar5;
      iVar30 = -(uint)(iVar31 < auVar17._0_4_);
      auVar32._4_4_ = -(uint)(iVar10 < auVar17._4_4_);
      iVar34 = -(uint)(iVar35 < auVar17._8_4_);
      auVar32._12_4_ = -(uint)(iVar11 < auVar17._12_4_);
      auVar19._4_4_ = iVar30;
      auVar19._0_4_ = iVar30;
      auVar19._8_4_ = iVar34;
      auVar19._12_4_ = iVar34;
      auVar26._4_4_ = -(uint)(auVar17._4_4_ == iVar10);
      auVar26._12_4_ = -(uint)(auVar17._12_4_ == iVar11);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar17 = auVar26 & auVar19 | auVar32;
      auVar17 = packssdw(auVar17,auVar17);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar1,auVar17 ^ auVar1);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)((long)ct + uVar8 * 2 + 8) = sVar3 + sVar4 + 2;
      }
      auVar20 = pshufhw(auVar19,auVar19,0x84);
      auVar27 = pshufhw(auVar26,auVar26,0x84);
      auVar18 = pshufhw(auVar20,auVar32,0x84);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar18 | auVar27 & auVar20) ^ auVar21;
      auVar20 = packssdw(auVar21,auVar21);
      if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)((long)ct + uVar8 * 2 + 10) = sVar3 + sVar4 + 3;
      }
      auVar20 = auVar14 ^ auVar5;
      iVar30 = -(uint)(iVar31 < auVar20._0_4_);
      auVar23._4_4_ = -(uint)(iVar10 < auVar20._4_4_);
      iVar34 = -(uint)(iVar35 < auVar20._8_4_);
      auVar23._12_4_ = -(uint)(iVar11 < auVar20._12_4_);
      auVar28._4_4_ = iVar30;
      auVar28._0_4_ = iVar30;
      auVar28._8_4_ = iVar34;
      auVar28._12_4_ = iVar34;
      auVar17 = pshuflw(auVar17,auVar28,0xe8);
      auVar22._4_4_ = -(uint)(auVar20._4_4_ == iVar10);
      auVar22._12_4_ = -(uint)(auVar20._12_4_ == iVar11);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar20 = pshuflw(auVar38 & auVar36,auVar22,0xe8);
      in_XMM12 = auVar20 & auVar17;
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar17 = pshuflw(auVar17,auVar23,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar17 | in_XMM12) ^ auVar36;
      auVar17 = packssdw(auVar36,auVar36);
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)((long)ct + uVar8 * 2 + 0xc) = sVar3 + sVar4 + 4;
      }
      auVar23 = auVar22 & auVar28 | auVar23;
      auVar17 = packssdw(auVar23,auVar23);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar38,auVar17 ^ auVar38);
      if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(short *)((long)ct + uVar8 * 2 + 0xe) = sVar3 + sVar4 + 5;
      }
      auVar17 = auVar12 ^ auVar5;
      iVar31 = -(uint)(iVar31 < auVar17._0_4_);
      auVar33._4_4_ = -(uint)(iVar10 < auVar17._4_4_);
      iVar35 = -(uint)(iVar35 < auVar17._8_4_);
      auVar33._12_4_ = -(uint)(iVar11 < auVar17._12_4_);
      auVar24._4_4_ = iVar31;
      auVar24._0_4_ = iVar31;
      auVar24._8_4_ = iVar35;
      auVar24._12_4_ = iVar35;
      auVar29._4_4_ = -(uint)(auVar17._4_4_ == iVar10);
      auVar29._12_4_ = -(uint)(auVar17._12_4_ == iVar11);
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar17 = auVar29 & auVar24 | auVar33;
      auVar17 = packssdw(auVar17,auVar17);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar17 ^ auVar2,auVar17 ^ auVar2);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)((long)ct + uVar8 * 2 + 0x10) = sVar3 + sVar4 + 6;
      }
      auVar17 = pshufhw(auVar24,auVar24,0x84);
      auVar18 = pshufhw(auVar29,auVar29,0x84);
      auVar20 = pshufhw(auVar17,auVar33,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar20 | auVar18 & auVar17) ^ auVar25;
      auVar17 = packssdw(auVar25,auVar25);
      if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)((long)ct + uVar8 * 2 + 0x12) = sVar3 + sVar4 + 7;
      }
      uVar8 = uVar8 + 8;
      lVar13 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 8;
      auVar16._8_8_ = lVar13 + 8;
      lVar13 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar13 + 8;
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar13 + 8;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 8;
      auVar12._8_8_ = lVar13 + 8;
    } while ((uVar7 + 7 & 0xfffffffffffffff8) != uVar8);
    uVar8 = 0;
    do {
      ct[(ulong)(uVar6 >> 1) + uVar8 * 2 + 2] = nbBits * 0x10000 - uVar6;
      ct[(ulong)(uVar6 >> 1) + uVar8 * 2 + 1] = (int)uVar8 - 1;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    return 0;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t FSE_buildCTable_raw (FSE_CTable* ct, unsigned nbBits)
{
    const unsigned tableSize = 1 << nbBits;
    const unsigned tableMask = tableSize - 1;
    const unsigned maxSymbolValue = tableMask;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableSize>>1);   /* assumption : tableLog >= 1 */
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    unsigned s;

    /* Sanity checks */
    if (nbBits < 1) return ERROR(GENERIC);             /* min size */

    /* header */
    tableU16[-2] = (U16) nbBits;
    tableU16[-1] = (U16) maxSymbolValue;

    /* Build table */
    for (s=0; s<tableSize; s++)
        tableU16[s] = (U16)(tableSize + s);

    /* Build Symbol Transformation Table */
    {   const U32 deltaNbBits = (nbBits << 16) - (1 << nbBits);
        for (s=0; s<=maxSymbolValue; s++) {
            symbolTT[s].deltaNbBits = deltaNbBits;
            symbolTT[s].deltaFindState = s-1;
    }   }

    return 0;
}